

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O3

void __thiscall
ExecutorTest_VoidFunctionCallWorks_Test::~ExecutorTest_VoidFunctionCallWorks_Test
          (ExecutorTest_VoidFunctionCallWorks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExecutorTest, VoidFunctionCallWorks)
{
  std::string source = R"SRC(
  fn test(x: f32): void
  {
    print("test " : x);
  }

  fn main(): f32
  {
    test(4);
    ret 0;
  }
  )SRC";

  std::string expected = "test 4.000000\n";

  testProgram(source, expected, 0);
}